

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_inline_table<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  vector<toml::error_info,_std::allocator<toml::error_info>_> *this;
  pointer peVar1;
  pointer peVar2;
  element_type *peVar3;
  value_type pbVar4;
  long lVar5;
  value_t vVar6;
  char_type_conflict cVar7;
  bool bVar8;
  value_type *pvVar9;
  value_type *ppbVar10;
  reference pvVar11;
  error_type *peVar12;
  error_type *peVar13;
  error_type *peVar14;
  value_type *pvVar15;
  basic_value<toml::type_config> *v;
  undefined **__x;
  string *this_00;
  ulong uVar16;
  bool bVar17;
  table_format_info fmt;
  ulong local_cf8;
  long local_cf0;
  optional<toml::detail::multiline_spacer<toml::type_config>_> spacer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c78;
  type val;
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  com_res;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  undefined1 local_a28 [40];
  table_type table;
  basic_value<toml::type_config> retval;
  type key_reg;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_810;
  location first;
  region local_790;
  source_location local_728;
  source_location local_6b0;
  source_location local_638;
  source_location local_5c0;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  error_info local_4e8;
  error_info local_490;
  error_info local_438;
  basic_value<toml::type_config> local_3e0;
  region local_318;
  error_info local_2b0;
  error_info local_258;
  error_info local_200;
  error_info local_1a8;
  error_info local_150;
  basic_value<toml::type_config> local_f8;
  
  peVar1 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  peVar2 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_start;
  location::location(&first,loc);
  peVar3 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((loc->location_ <
       (ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start)) &&
     (cVar7 = location::current(loc), cVar7 == '{')) {
    location::advance(loc,1);
    table._M_h._M_buckets = &table._M_h._M_single_bucket;
    table._M_h._M_bucket_count = 1;
    table._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    table._M_h._M_element_count = 0;
    table._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    table._M_h._M_rehash_policy._M_next_resize = 0;
    table._M_h._M_single_bucket = (__node_base_ptr)0x0;
    spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
    _M_payload.
    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_engaged =
         false;
    if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == true) {
      skip_multiline_spacer<toml::type_config>
                ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)&retval,loc,ctx,
                 false);
      std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
      _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                     &spacer,(_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              *)&retval);
      std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                 &retval);
      local_cf8 = 0x201;
      if (spacer.
          super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_engaged == true) {
        local_cf8 = (ulong)spacer.
                           super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                           .
                           super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                           ._M_payload._M_value.newline_found * 2 + 0x201;
      }
    }
    else {
      local_cf8 = 0x201;
      skip_whitespace<toml::type_config>(loc,ctx);
    }
    this = &ctx->errors_;
    bVar8 = true;
    local_cf0 = 0;
    bVar17 = false;
LAB_003370be:
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) goto LAB_003376d2;
    cVar7 = location::current(loc);
    if (cVar7 != '}') {
      if (bVar8 || bVar17) {
        if (((spacer.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_engaged == true) &&
            (spacer.
             super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
             _M_payload.
             super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
             .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
             _M_payload._M_value.newline_found == true)) &&
           (spacer.
            super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
            _M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_payload._M_value.indent_type != none)) {
          local_cf8 = (ulong)((uint)local_cf8 & 0xffff00ff) |
                      (ulong)spacer.
                             super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                             .
                             super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                             ._M_payload._M_value.indent_type << 8 |
                      (ulong)(uint)spacer.
                                   super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                   ._M_payload._M_value.indent << 0x20;
        }
        parse_key_value_pair<toml::type_config>
                  ((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                    *)&retval,loc,ctx);
        vVar6 = retval.type_;
        if (retval.type_ == boolean) {
          pvVar9 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                   ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                             *)&retval,(source_location)0x4e94e0);
          local_c78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar9->first).first.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_c78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pvVar9->first).first.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_c78.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pvVar9->first).first.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pvVar9->first).first.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar9->first).first.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pvVar9->first).first.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvVar9 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                   ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                             *)&retval,(source_location)0x4e94f8);
          region::region(&key_reg,&(pvVar9->first).second);
          pvVar9 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                   ::unwrap((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                             *)&retval,(source_location)0x4e9510);
          basic_value<toml::type_config>::basic_value(&val,&pvVar9->second);
          region::region(&local_318,&key_reg);
          basic_value<toml::type_config>::basic_value(&local_f8,&val);
          insert_value<toml::type_config>
                    (&ins_res,dotted_keys,&table,&local_c78,&local_318,&local_f8);
          basic_value<toml::type_config>::~basic_value(&local_f8);
          region::~region(&local_318);
          if (ins_res.is_ok_ != false) {
            if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == true) {
              if (spacer.
                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                  .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                  _M_engaged == true) {
                uVar16 = 0;
                do {
                  if ((spacer.
                       super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                       .
                       super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                       ._M_engaged & 1U) == 0) {
LAB_00337b93:
                    std::__throw_bad_optional_access();
                  }
                  if ((ulong)((long)spacer.
                                    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                    ._M_payload._M_value.comments.comments.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              spacer.
                              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                              .
                              super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              ._M_payload._8_8_ >> 5) <= uVar16) break;
                  ppbVar10 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::
                             unwrap(&ins_res,(source_location)0x4e9540);
                  if (spacer.
                      super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                      .
                      super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                      ._M_engaged != true) goto LAB_00337b93;
                  pbVar4 = *ppbVar10;
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::at(&spacer.
                                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                  ._M_payload._M_value.comments.comments,uVar16);
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&pbVar4->comments_,pvVar11);
                  uVar16 = uVar16 + 1;
                } while( true );
              }
              skip_multiline_spacer<toml::type_config>
                        ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)&com_res,
                         loc,ctx,false);
              std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
              _M_move_assign((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              *)&spacer,
                             (_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              *)&com_res);
              std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::
              _M_reset((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *
                       )&com_res);
              if (spacer.
                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                  .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                  _M_engaged == true) {
                uVar16 = 0;
                do {
                  if ((spacer.
                       super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                       .
                       super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                       ._M_engaged & 1U) == 0) {
LAB_00337b98:
                    std::__throw_bad_optional_access();
                  }
                  if ((ulong)((long)spacer.
                                    super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                    ._M_payload._M_value.comments.comments.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              spacer.
                              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                              .
                              super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                              ._M_payload._8_8_ >> 5) <= uVar16) goto LAB_00337467;
                  ppbVar10 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::
                             unwrap(&ins_res,(source_location)0x4e9558);
                  if (spacer.
                      super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                      .
                      super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                      ._M_engaged != true) goto LAB_00337b98;
                  pbVar4 = *ppbVar10;
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::at(&spacer.
                                  super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                                  ._M_payload._M_value.comments.comments,uVar16);
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&pbVar4->comments_,pvVar11);
                  uVar16 = uVar16 + 1;
                } while( true );
              }
            }
            else {
              skip_whitespace<toml::type_config>(loc,ctx);
            }
            goto LAB_003374a5;
          }
          peVar13 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                              (&ins_res,(source_location)0x4e9528);
          error_info::error_info(&local_438,peVar13);
          __x = (undefined **)&local_438;
          std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
          emplace_back<toml::error_info>(this,&local_438);
          error_info::~error_info(&local_438);
          while (peVar3 = (loc->source_).
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,
                loc->location_ <
                (ulong)((long)(peVar3->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar3->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)) {
            cVar7 = location::current(loc);
            if (((cVar7 == '\n') || (cVar7 == '}')) || (cVar7 == ',')) {
              bVar17 = cVar7 == ',';
              break;
            }
            __x = (undefined **)0x1;
            location::advance(loc,1);
          }
          goto LAB_00337643;
        }
        peVar12 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                  ::unwrap_err((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                                *)&retval,(source_location)0x4e95d0);
        error_info::error_info(&local_4e8,peVar12);
        __x = (undefined **)&local_4e8;
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(this,&local_4e8);
        error_info::~error_info(&local_4e8);
        while (((peVar3 = (loc->source_).
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,
                loc->location_ <
                (ulong)((long)(peVar3->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(peVar3->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start) &&
                (cVar7 = location::current(loc), cVar7 != '}')) &&
               (((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables != false ||
                (cVar7 = location::current(loc), cVar7 != '\n'))))) {
          __x = (undefined **)0x1;
          location::advance(loc,1);
        }
        goto LAB_00337672;
      }
      region::region((region *)&val,loc);
      source_location::source_location((source_location *)&retval,(region *)&val);
      region::~region((region *)&val);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ac8,
                 "toml::parse_inline_table: expected value-separator `,` or closing `}`",
                 (allocator<char> *)&key_reg);
      source_location::source_location(&local_6b0,(source_location *)&retval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae8,"here",(allocator<char> *)&com_res);
      make_error_info<>((error_info *)&val,&local_ac8,&local_6b0,&local_ae8);
      err<toml::error_info>((failure<toml::error_info> *)&local_200,(error_info *)&val);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_200);
      error_info::~error_info(&local_200);
      error_info::~error_info((error_info *)&val);
      std::__cxx11::string::~string((string *)&local_ae8);
      source_location::~source_location(&local_6b0);
      this_00 = &local_ac8;
      goto LAB_00337b29;
    }
    if ((bVar17) && ((ctx->toml_spec_).v1_1_0_allow_trailing_comma_in_inline_tables == false)) {
      region::region((region *)&val,loc);
      source_location::source_location((source_location *)&retval,(region *)&val);
      region::~region((region *)&val);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a88,
                 "toml::parse_inline_table: trailing comma is not allowed in TOML-v1.0.0)",
                 (allocator<char> *)&key_reg);
      source_location::source_location(&local_638,(source_location *)&retval);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_aa8,"here",(allocator<char> *)&com_res);
      make_error_info<>((error_info *)&val,&local_a88,&local_638,&local_aa8);
      err<toml::error_info>((failure<toml::error_info> *)&local_1a8,(error_info *)&val);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_1a8);
      error_info::~error_info(&local_1a8);
      error_info::~error_info((error_info *)&val);
      std::__cxx11::string::~string((string *)&local_aa8);
      source_location::~source_location(&local_638);
      this_00 = &local_a88;
      goto LAB_00337b29;
    }
    if (((((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == true) &&
         (spacer.
          super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_engaged == true)) &&
        (spacer.
         super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
         _M_payload.
         super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
         .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
         _M_payload._M_value.newline_found == true)) &&
       (spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
        ._M_payload.
        super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
        .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload
        ._M_value.indent_type != none)) {
      local_cf8 = local_cf8 & 0xffffffffffff00ff |
                  (ulong)spacer.
                         super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                         .
                         super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                         ._M_payload._M_value.indent_type << 8;
      local_cf0 = (ulong)(uint)spacer.
                               super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                               ._M_payload.
                               super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                               .
                               super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                               ._M_payload._M_value.indent << 0x20;
      goto LAB_003376d2;
    }
    goto LAB_003376c9;
  }
  region::region((region *)&val,loc);
  source_location::source_location((source_location *)&retval,(region *)&val);
  region::~region((region *)&val);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"toml::parse_inline_table: The next token is not an inline table",
             (allocator<char> *)&key_reg);
  source_location::source_location(&local_5c0,(source_location *)&retval);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"here",(allocator<char> *)&com_res);
  make_error_info<>((error_info *)&val,&local_a48,&local_5c0,&local_a68);
  err<toml::error_info>((failure<toml::error_info> *)&local_150,(error_info *)&val);
  result<toml::basic_value<toml::type_config>,_toml::error_info>::result
            (__return_storage_ptr__,(failure_type *)&local_150);
  error_info::~error_info(&local_150);
  error_info::~error_info((error_info *)&val);
  std::__cxx11::string::~string((string *)&local_a68);
  source_location::~source_location(&local_5c0);
  std::__cxx11::string::~string((string *)&local_a48);
  source_location::~source_location((source_location *)&retval);
LAB_00337b52:
  location::~location(&first);
  return __return_storage_ptr__;
LAB_00337467:
  if ((spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
       _M_payload.
       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
       .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
       _M_value.newline_found == true) &&
     (local_cf8 = local_cf8 & 0xffffffffffffff00 | 3,
     spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
     _M_payload.
     super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>.
     super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload.
     _M_value.indent_type != none)) {
    local_cf8 = (ulong)((uint)local_cf8 & 0xffff0003) |
                (ulong)spacer.
                       super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                       .
                       super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                       ._M_payload._M_value.indent_type << 8 |
                (ulong)(uint)spacer.
                             super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                             .
                             super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>
                             ._M_payload._M_value.indent << 0x20;
  }
LAB_003374a5:
  local_a28._0_8_ = &PTR__scanner_base_004e8900;
  local_a28[8] = ',';
  character::scan((region *)&com_res,(character *)local_a28,loc);
  lVar5 = CONCAT71(com_res._1_7_,com_res.is_ok_);
  bVar17 = lVar5 != 0;
  region::~region((region *)&com_res);
  if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables != true) {
    __x = (undefined **)ctx;
    skip_whitespace<toml::type_config>(loc,ctx);
    goto LAB_00337643;
  }
  __x = (undefined **)loc;
  parse_comment_line<toml::type_config>(&com_res,loc,ctx);
  if (com_res.is_ok_ == false) {
    peVar14 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
              ::unwrap_err(&com_res,(source_location)0x4e9570);
    error_info::error_info(&local_490,peVar14);
    __x = (undefined **)&local_490;
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::emplace_back<toml::error_info>
              (this,&local_490);
    error_info::~error_info(&local_490);
  }
  if ((com_res.is_ok_ & 1U) == 0) {
LAB_003375df:
    bVar8 = false;
  }
  else {
    __x = &PTR_s__workspace_llm4binary_github_lic_004e9588;
    pvVar15 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
              ::unwrap(&com_res,(source_location)0x4e9588);
    if ((pvVar15->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged != true) goto LAB_003375df;
    ppbVar10 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap
                         (&ins_res,(source_location)0x4e95a0);
    pbVar4 = *ppbVar10;
    pvVar15 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
              ::unwrap(&com_res,(source_location)0x4e95b8);
    __x = (undefined **)
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value(pvVar15);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pbVar4->comments_,(value_type *)__x);
    local_cf8 = local_cf8 & 0xffffffffffffff00 | 3;
    bVar8 = true;
  }
  if (lVar5 != 0) {
    skip_multiline_spacer<toml::type_config>
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)local_a28,loc,ctx,
               bVar8);
    __x = (undefined **)local_a28;
    std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_move_assign
              ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&spacer
               ,(_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
                local_a28);
    std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
              ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)
               local_a28);
    if ((spacer.
         super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
         _M_payload.
         super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
         .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
         _M_engaged == true) &&
       (spacer.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
        ._M_payload.
        super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
        .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>._M_payload
        ._M_value.newline_found == true)) {
      local_cf8 = local_cf8 & 0xffffffffffffff00 | 3;
    }
  }
  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
  ::cleanup(&com_res,(EVP_PKEY_CTX *)__x);
LAB_00337643:
  result<toml::basic_value<toml::type_config>_*,_toml::error_info>::cleanup
            (&ins_res,(EVP_PKEY_CTX *)__x);
  basic_value<toml::type_config>::~basic_value(&val);
  region::~region(&key_reg);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c78);
LAB_00337672:
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  ::cleanup((result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
             *)&retval,(EVP_PKEY_CTX *)__x);
  bVar8 = false;
  if (vVar6 == empty) goto LAB_003376c9;
  goto LAB_003370be;
LAB_003376c9:
  local_cf0 = 0;
LAB_003376d2:
  cVar7 = location::current(loc);
  if (cVar7 == '}') {
    location::advance(loc,1);
    if ((ulong)((long)peVar1 - (long)peVar2) <
        (ulong)((long)(ctx->errors_).
                      super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(ctx->errors_).
                     super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl
                     .super__Vector_impl_data._M_start)) {
      context<toml::type_config>::pop_last_error((error_info *)&retval,ctx);
      err<toml::error_info>((failure<toml::error_info> *)&local_2b0,(error_info *)&retval);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_2b0);
      error_info::~error_info(&local_2b0);
      error_info::~error_info((error_info *)&retval);
    }
    else {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_810,&table._M_h);
      local_c98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      region::region(&local_790,&first,loc);
      fmt.name_indent = (undefined4)local_cf0;
      fmt.closing_indent = local_cf0._4_4_;
      fmt.fmt = (char)local_cf8;
      fmt.indent_type = (char)(local_cf8 >> 8);
      fmt._2_2_ = (short)(local_cf8 >> 0x10);
      fmt.body_indent = (int)(local_cf8 >> 0x20);
      basic_value<toml::type_config>::basic_value
                (&retval,(table_type *)&local_810,fmt,&local_c98,&local_790);
      region::~region(&local_790);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_c98);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_810);
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_3e0,(toml *)&retval,v);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(success_type *)&local_3e0);
      basic_value<toml::type_config>::~basic_value(&local_3e0);
      basic_value<toml::type_config>::~basic_value(&retval);
    }
  }
  else {
    region::region((region *)&val,loc);
    source_location::source_location((source_location *)&retval,(region *)&val);
    region::~region((region *)&val);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b08,"toml::parse_inline_table: missing closing bracket `}`",
               (allocator<char> *)&key_reg);
    source_location::source_location(&local_728,(source_location *)&retval);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b28,"expected `}`, reached line end",(allocator<char> *)&com_res);
    make_error_info<>((error_info *)&val,&local_b08,&local_728,&local_b28);
    err<toml::error_info>((failure<toml::error_info> *)&local_258,(error_info *)&val);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_258);
    error_info::~error_info(&local_258);
    error_info::~error_info((error_info *)&val);
    std::__cxx11::string::~string((string *)&local_b28);
    source_location::~source_location(&local_728);
    this_00 = &local_b08;
LAB_00337b29:
    std::__cxx11::string::~string((string *)this_00);
    source_location::~source_location((source_location *)&retval);
  }
  std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
            ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&spacer);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&table._M_h);
  goto LAB_00337b52;
}

Assistant:

result<basic_value<TC>, error_info>
parse_inline_table(location& loc, context<TC>& ctx)
{
    using table_type = typename basic_value<TC>::table_type;

    const auto num_errors = ctx.errors().size();

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    if(loc.eof() || loc.current() != '{')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "The next token is not an inline table", std::move(src), "here"));
    }
    loc.advance();

    table_type table;
    table_format_info fmt;
    fmt.fmt = table_format::oneline;
    fmt.indent_type = indent_char::none;

    cxx::optional<multiline_spacer<TC>> spacer(cxx::make_nullopt());

    if(spec.v1_1_0_allow_newlines_in_inline_tables)
    {
        spacer = skip_multiline_spacer(loc, ctx);
        if(spacer.has_value() && spacer.value().newline_found)
        {
            fmt.fmt = table_format::multiline_oneline;
        }
    }
    else
    {
        skip_whitespace(loc, ctx);
    }

    bool still_empty = true;
    bool comma_found = false;
    while( ! loc.eof())
    {
        // closing!
        if(loc.current() == '}')
        {
            if(comma_found && ! spec.v1_1_0_allow_trailing_comma_in_inline_tables)
            {
                auto src = source_location(region(loc));
                return err(make_error_info("toml::parse_inline_table: trailing "
                    "comma is not allowed in TOML-v1.0.0)", std::move(src), "here"));
            }

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value() && spacer.value().newline_found &&
                    spacer.value().indent_type != indent_char::none)
                {
                    fmt.indent_type    = spacer.value().indent_type;
                    fmt.closing_indent = spacer.value().indent;
                }
            }
            break;
        }

        // if we already found a value and didn't found `,` nor `}`, error.
        if( ! comma_found && ! still_empty)
        {
            auto src = source_location(region(loc));
            return err(make_error_info("toml::parse_inline_table: "
                    "expected value-separator `,` or closing `}`",
                    std::move(src), "here"));
        }

        // parse indent.
        if(spacer.has_value() && spacer.value().newline_found &&
            spacer.value().indent_type != indent_char::none)
        {
            fmt.indent_type = spacer.value().indent_type;
            fmt.body_indent = spacer.value().indent;
        }

        still_empty = false; // parsing a value...
        if(auto kv_res = parse_key_value_pair<TC>(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                std::addressof(table), keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
                // we need to skip until the next value (or end of the table)
                // because we don't have valid kv pair.
                while( ! loc.eof())
                {
                    const auto c = loc.current();
                    if(c == ',' || c == '\n' || c == '}')
                    {
                        comma_found = (c == ',');
                        break;
                    }
                    loc.advance();
                }
                continue;
            }

            // if comment line follows immediately(without newline) after `,`, then
            // the comment is for the elem. we need to check if comment follows `,`.
            //
            // (key) = (val) (ws|newline|comment-line)? `,` (ws)? (comment)?

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                if(spacer.has_value()) // copy previous comments to value
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                }
                spacer = skip_multiline_spacer(loc, ctx);
                if(spacer.has_value())
                {
                    for(std::size_t i=0; i<spacer.value().comments.size(); ++i)
                    {
                        ins_res.unwrap()->comments().push_back(spacer.value().comments.at(i));
                    }
                    if(spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                        if(spacer.value().indent_type != indent_char::none)
                        {
                            fmt.indent_type = spacer.value().indent_type;
                            fmt.body_indent = spacer.value().indent;
                        }
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }

            comma_found = character(',').scan(loc).is_ok();

            if(spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                auto com_res = parse_comment_line(loc, ctx);
                if(com_res.is_err())
                {
                    ctx.report_error(com_res.unwrap_err());
                }
                const bool comment_found = com_res.is_ok() && com_res.unwrap().has_value();
                if(comment_found)
                {
                    fmt.fmt = table_format::multiline_oneline;
                    ins_res.unwrap()->comments().push_back(com_res.unwrap().value());
                }
                if(comma_found)
                {
                    spacer = skip_multiline_spacer(loc, ctx, comment_found);
                    if(spacer.has_value() && spacer.value().newline_found)
                    {
                        fmt.fmt = table_format::multiline_oneline;
                    }
                }
            }
            else
            {
                skip_whitespace(loc, ctx);
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            while( ! loc.eof())
            {
                if(loc.current() == '}')
                {
                    break;
                }
                if( ! spec.v1_1_0_allow_newlines_in_inline_tables && loc.current() == '\n')
                {
                    break;
                }
                loc.advance();
            }
            break;
        }
    }

    if(loc.current() != '}')
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_inline_table: "
            "missing closing bracket `}`",
            std::move(src), "expected `}`, reached line end"));
    }
    else
    {
        loc.advance(); // skip }
    }

    // any error reported from this function
    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }

    basic_value<TC> retval(
        std::move(table), std::move(fmt), {}, region(first, loc));

    return ok(std::move(retval));
}